

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OFFReader.cc
# Opt level: O1

bool __thiscall
OpenMesh::IO::_OFFReader_::read_ascii
          (_OFFReader_ *this,istream *_in,BaseImporter *_bi,Options *_opt)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  ostream *poVar5;
  vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *this_00;
  _OFFReader_ *p_Var6;
  uint uVar7;
  float fVar8;
  stringstream local_2d8 [8];
  stringstream stream;
  ios_base local_258 [264];
  size_type *local_150;
  string header;
  uint dummy;
  Vec3f v;
  Vec3f n;
  Vec2f t;
  uint k;
  uint l;
  uint idx;
  string line;
  string trash;
  undefined1 local_b8 [8];
  Vec4f c4f;
  VHandles vhandles;
  undefined1 local_84 [8];
  Vec3f c3f;
  uint nF;
  Vec3i c3;
  Vec4i c4;
  uint local_44;
  uint nV;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  c4f.super_VectorDataT<float,_4>.field_0._8_8_ = 0;
  vhandles.super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_150 = &header._M_string_length;
  header._M_dataplus._M_p = (pointer)0x0;
  header._M_string_length._0_1_ = 0;
  cVar1 = (char)_in;
  trash.field_2._8_8_ = _opt;
  cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)_in + -0x18) + cVar1);
  std::getline<char,std::char_traits<char>,std::allocator<char>>(_in,(string *)&local_150,cVar2);
  std::istream::_M_extract<unsigned_int>((uint *)_in);
  std::istream::_M_extract<unsigned_int>((uint *)_in);
  std::istream::_M_extract<unsigned_int>((uint *)_in);
  (*_bi->_vptr_BaseImporter[0x1b])
            (_bi,(ulong)local_44,(ulong)(local_44 * 3),
             (ulong)(uint)c3f.super_VectorDataT<float,_3>.values_[1]);
  if (local_44 != 0) {
    uVar7 = 0;
    do {
      if (((byte)_in[*(long *)(*(long *)_in + -0x18) + 0x20] & 2) != 0) break;
      std::istream::_M_extract<float>((float *)_in);
      std::istream::_M_extract<float>((float *)_in);
      std::istream::_M_extract<float>((float *)_in);
      uVar3 = (*_bi->_vptr_BaseImporter[2])(_bi,(undefined1 *)((long)&header.field_2 + 0xc));
      if (((this->options_).flags_ & 0x10) != 0) {
        std::istream::_M_extract<float>((float *)_in);
        std::istream::_M_extract<float>((float *)_in);
        std::istream::_M_extract<float>((float *)_in);
        if (((this->userOptions_).flags_ & 0x10) != 0) {
          (*_bi->_vptr_BaseImporter[8])(_bi,(ulong)uVar3,v.super_VectorDataT<float,_3>.values_ + 1);
        }
      }
      line._M_dataplus._M_p = (pointer)0x0;
      line._M_string_length._0_1_ = 0;
      _l = (pointer)&line._M_string_length;
      cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)_in + -0x18) + cVar1);
      p_Var6 = (_OFFReader_ *)_in;
      std::getline<char,std::char_traits<char>,std::allocator<char>>(_in,(string *)&l,cVar2);
      iVar4 = getColorType(p_Var6,(string *)&l,SUB41(((this->options_).flags_ & 0x40U) >> 6,0));
      std::__cxx11::stringstream::stringstream(local_2d8,(string *)&l,_S_out|_S_in);
      if (((this->options_).flags_ & 0x20) != 0) {
        line.field_2._8_8_ = &trash._M_string_length;
        trash._M_dataplus._M_p = (pointer)0x0;
        trash._M_string_length._0_1_ = 0;
        switch(iVar4) {
        case 0:
          break;
        case 2:
          std::operator>>((istream *)local_2d8,(string *)(line.field_2._M_local_buf + 8));
        case 1:
          std::operator>>((istream *)local_2d8,(string *)(line.field_2._M_local_buf + 8));
          break;
        case 3:
          std::istream::operator>>(local_2d8,(int *)(c3f.super_VectorDataT<float,_3>.values_ + 2));
          std::istream::operator>>(local_2d8,(int *)&nF);
          std::istream::operator>>(local_2d8,(int *)&c3);
          if (((this->userOptions_).flags_ & 0x20) != 0) {
            local_34 = c3f.super_VectorDataT<float,_3>.values_[2]._0_1_;
            local_33 = (undefined1)nF;
            local_32 = (undefined1)c3.super_VectorDataT<int,_3>.values_[0];
            (*_bi->_vptr_BaseImporter[9])(_bi,(ulong)uVar3,&local_34);
          }
          break;
        case 4:
          std::istream::operator>>(local_2d8,c3.super_VectorDataT<int,_3>.values_ + 1);
          std::istream::operator>>(local_2d8,c3.super_VectorDataT<int,_3>.values_ + 2);
          std::istream::operator>>(local_2d8,(int *)&c4);
          std::istream::operator>>(local_2d8,c4.super_VectorDataT<int,_4>.values_ + 1);
          if (((this->userOptions_).flags_ & 0x20) != 0) {
            local_34 = (undefined1)c3.super_VectorDataT<int,_3>.values_[1];
            local_33 = (undefined1)c3.super_VectorDataT<int,_3>.values_[2];
            local_32 = (undefined1)c4.super_VectorDataT<int,_4>.values_[0];
            local_31 = (undefined1)c4.super_VectorDataT<int,_4>.values_[1];
            (*_bi->_vptr_BaseImporter[10])(_bi,(ulong)uVar3,&local_34);
          }
          break;
        case 5:
          std::istream::_M_extract<float>((float *)local_2d8);
          std::istream::_M_extract<float>((float *)local_2d8);
          std::istream::_M_extract<float>((float *)local_2d8);
          if (((this->userOptions_).flags_ & 0x20) != 0) {
            (*_bi->_vptr_BaseImporter[0xb])(_bi,(ulong)uVar3,local_84);
LAB_00177e3d:
            *(byte *)(trash.field_2._8_8_ + 1) = *(byte *)(trash.field_2._8_8_ + 1) | 0x10;
          }
          break;
        case 6:
          std::istream::_M_extract<float>((float *)local_2d8);
          std::istream::_M_extract<float>((float *)local_2d8);
          std::istream::_M_extract<float>((float *)local_2d8);
          std::istream::_M_extract<float>((float *)local_2d8);
          if (((this->userOptions_).flags_ & 0x20) != 0) {
            (*_bi->_vptr_BaseImporter[0xc])(_bi,(ulong)uVar3,local_b8);
            goto LAB_00177e3d;
          }
          break;
        default:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in file format (colorType = ",0x22);
          poVar5 = (ostream *)std::ostream::operator<<(&std::cerr,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,")\n",2);
        }
        if ((size_type *)line.field_2._8_8_ != &trash._M_string_length) {
          operator_delete((void *)line.field_2._8_8_);
        }
      }
      if (((this->options_).flags_ & 0x40) != 0) {
        std::istream::_M_extract<float>((float *)local_2d8);
        std::istream::_M_extract<float>((float *)local_2d8);
        if (((this->userOptions_).flags_ & 0x40) != 0) {
          (*_bi->_vptr_BaseImporter[0xd])
                    (_bi,(ulong)uVar3,n.super_VectorDataT<float,_3>.values_ + 1);
        }
      }
      std::__cxx11::stringstream::~stringstream(local_2d8);
      std::ios_base::~ios_base(local_258);
      if ((size_type *)_l != &line._M_string_length) {
        operator_delete(_l);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < local_44);
  }
  if (c3f.super_VectorDataT<float,_3>.values_[1] != 0.0) {
    fVar8 = 0.0;
    do {
      this_00 = (vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_> *)
                ((long)&c4f.super_VectorDataT<float,_4>.field_0 + 8);
      std::istream::_M_extract<unsigned_int>((uint *)_in);
      if (local_44 == 3) {
        std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::resize
                  (this_00,3);
        std::istream::_M_extract<unsigned_int>((uint *)_in);
        std::istream::_M_extract<unsigned_int>((uint *)_in);
        std::istream::_M_extract<unsigned_int>((uint *)_in);
        *(int *)c4f.super_VectorDataT<float,_4>.field_0._8_8_ =
             c4.super_VectorDataT<int,_4>.values_[2];
        *(float *)(c4f.super_VectorDataT<float,_4>.field_0._8_8_ + 4) =
             t.super_VectorDataT<float,_2>.values_[0];
        *(float *)(c4f.super_VectorDataT<float,_4>.field_0._8_8_ + 8) =
             t.super_VectorDataT<float,_2>.values_[1];
      }
      else {
        if (vhandles.
            super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (pointer)c4f.super_VectorDataT<float,_4>.field_0._8_8_) {
          vhandles.
          super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)c4f.super_VectorDataT<float,_4>.field_0._8_8_;
        }
        c4.super_VectorDataT<int,_4>.values_[2] = 0;
        if (local_44 != 0) {
          do {
            std::istream::_M_extract<unsigned_int>((uint *)_in);
            if (vhandles.
                super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
                _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
              std::vector<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>::
              _M_realloc_insert<OpenMesh::VertexHandle>
                        (this_00,(iterator)0x0,(VertexHandle *)local_2d8);
            }
            else {
              ((vhandles.
                super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
                _M_impl.super__Vector_impl_data._M_start)->super_BaseHandle).idx_ = k;
              vhandles.
              super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   vhandles.
                   super__Vector_base<OpenMesh::VertexHandle,_std::allocator<OpenMesh::VertexHandle>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1;
            }
            c4.super_VectorDataT<int,_4>.values_[2] = c4.super_VectorDataT<int,_4>.values_[2] + 1;
          } while ((uint)c4.super_VectorDataT<int,_4>.values_[2] < local_44);
        }
      }
      iVar4 = (*_bi->_vptr_BaseImporter[4])(_bi,this_00);
      if (((this->options_).flags_ & 0x200) != 0) {
        _l = (pointer)&line._M_string_length;
        line._M_dataplus._M_p = (pointer)0x0;
        line._M_string_length._0_1_ = 0;
        c4.super_VectorDataT<int,_4>.values_[3] = iVar4;
        cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)_in + -0x18) + cVar1);
        p_Var6 = (_OFFReader_ *)_in;
        std::getline<char,std::char_traits<char>,std::allocator<char>>(_in,(string *)&l,cVar2);
        iVar4 = getColorType(p_Var6,(string *)&l,false);
        std::__cxx11::stringstream::stringstream(local_2d8,(string *)&l,_S_out|_S_in);
        line.field_2._8_8_ = &trash._M_string_length;
        trash._M_dataplus._M_p = (pointer)0x0;
        trash._M_string_length._0_1_ = 0;
        switch(iVar4) {
        case 0:
          break;
        case 2:
          std::operator>>((istream *)local_2d8,(string *)(line.field_2._M_local_buf + 8));
        case 1:
          std::operator>>((istream *)local_2d8,(string *)(line.field_2._M_local_buf + 8));
          break;
        case 3:
          std::istream::operator>>(local_2d8,(int *)(c3f.super_VectorDataT<float,_3>.values_ + 2));
          std::istream::operator>>(local_2d8,(int *)&nF);
          std::istream::operator>>(local_2d8,(int *)&c3);
          if (((this->userOptions_).flags_ & 0x200) != 0) {
            local_34 = c3f.super_VectorDataT<float,_3>.values_[2]._0_1_;
            local_33 = (undefined1)nF;
            local_32 = (undefined1)c3.super_VectorDataT<int,_3>.values_[0];
            (*_bi->_vptr_BaseImporter[0x14])
                      (_bi,(ulong)(uint)c4.super_VectorDataT<int,_4>.values_[3],&local_34);
          }
          break;
        case 4:
          std::istream::operator>>(local_2d8,c3.super_VectorDataT<int,_3>.values_ + 1);
          std::istream::operator>>(local_2d8,c3.super_VectorDataT<int,_3>.values_ + 2);
          std::istream::operator>>(local_2d8,(int *)&c4);
          std::istream::operator>>(local_2d8,c4.super_VectorDataT<int,_4>.values_ + 1);
          if (((this->userOptions_).flags_ & 0x200) != 0) {
            local_34 = (undefined1)c3.super_VectorDataT<int,_3>.values_[1];
            local_33 = (undefined1)c3.super_VectorDataT<int,_3>.values_[2];
            local_32 = (undefined1)c4.super_VectorDataT<int,_4>.values_[0];
            local_31 = (undefined1)c4.super_VectorDataT<int,_4>.values_[1];
            (*_bi->_vptr_BaseImporter[0x15])
                      (_bi,(ulong)(uint)c4.super_VectorDataT<int,_4>.values_[3],&local_34);
          }
          break;
        case 5:
          std::istream::_M_extract<float>((float *)local_2d8);
          std::istream::_M_extract<float>((float *)local_2d8);
          std::istream::_M_extract<float>((float *)local_2d8);
          if (((this->userOptions_).flags_ & 0x200) != 0) {
            (*_bi->_vptr_BaseImporter[0x16])
                      (_bi,(ulong)(uint)c4.super_VectorDataT<int,_4>.values_[3],local_84);
LAB_00178286:
            *(byte *)(trash.field_2._8_8_ + 1) = *(byte *)(trash.field_2._8_8_ + 1) | 0x10;
          }
          break;
        case 6:
          std::istream::_M_extract<float>((float *)local_2d8);
          std::istream::_M_extract<float>((float *)local_2d8);
          std::istream::_M_extract<float>((float *)local_2d8);
          std::istream::_M_extract<float>((float *)local_2d8);
          if (((this->userOptions_).flags_ & 0x200) != 0) {
            (*_bi->_vptr_BaseImporter[0x17])
                      (_bi,(ulong)(uint)c4.super_VectorDataT<int,_4>.values_[3],local_b8);
            goto LAB_00178286;
          }
          break;
        default:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in file format (colorType = ",0x22);
          poVar5 = (ostream *)std::ostream::operator<<(&std::cerr,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,")\n",2);
        }
        if ((size_type *)line.field_2._8_8_ != &trash._M_string_length) {
          operator_delete((void *)line.field_2._8_8_);
        }
        std::__cxx11::stringstream::~stringstream(local_2d8);
        std::ios_base::~ios_base(local_258);
        if ((size_type *)_l != &line._M_string_length) {
          operator_delete(_l);
        }
      }
      fVar8 = (float)((int)fVar8 + 1);
    } while ((uint)fVar8 < (uint)c3f.super_VectorDataT<float,_3>.values_[1]);
  }
  if (local_150 != &header._M_string_length) {
    operator_delete(local_150);
  }
  if (c4f.super_VectorDataT<float,_4>.field_0._8_8_ != 0) {
    operator_delete((void *)c4f.super_VectorDataT<float,_4>.field_0._8_8_);
  }
  return true;
}

Assistant:

bool
_OFFReader_::read_ascii(std::istream& _in, BaseImporter& _bi, Options& _opt) const
{


  unsigned int            i, j, k, l, idx;
  unsigned int            nV, nF, dummy;
  OpenMesh::Vec3f         v, n;
  OpenMesh::Vec2f         t;
  OpenMesh::Vec3i         c3;
  OpenMesh::Vec3f         c3f;
  OpenMesh::Vec4i         c4;
  OpenMesh::Vec4f         c4f;
  BaseImporter::VHandles  vhandles;
  VertexHandle            vh;

  // read header line
  std::string header;
  std::getline(_in,header);

  // + #Vertice, #Faces, #Edges
  _in >> nV;
  _in >> nF;
  _in >> dummy;

  _bi.reserve(nV, 3*nV, nF);

  // read vertices: coord [hcoord] [normal] [color] [texcoord]
  for (i=0; i<nV && !_in.eof(); ++i)
  {
    // Always read VERTEX
    _in >> v[0]; _in >> v[1]; _in >> v[2];

    vh = _bi.add_vertex(v);

    //perhaps read NORMAL
    if ( options_.vertex_has_normal() ){

      _in >> n[0]; _in >> n[1]; _in >> n[2];

      if ( userOptions_.vertex_has_normal() )
        _bi.set_normal(vh, n);
    }

    //take the rest of the line and check how colors are defined
    std::string line;
    std::getline(_in,line);

    int colorType = getColorType(line, options_.vertex_has_texcoord() );

    std::stringstream stream( line );

    //perhaps read COLOR
    if ( options_.vertex_has_color() ){

      std::string trash;

      switch (colorType){
        case 0 : break; //no color
        case 1 : stream >> trash; break; //one int (isn't handled atm)
        case 2 : stream >> trash; stream >> trash; break; //corrupt format (ignore)
        // rgb int
        case 3 : stream >> c3[0];  stream >> c3[1];  stream >> c3[2];
            if ( userOptions_.vertex_has_color() )
              _bi.set_color( vh, Vec3uc( c3 ) );
            break;
        // rgba int
        case 4 : stream >> c4[0];  stream >> c4[1];  stream >> c4[2]; stream >> c4[3];
            if ( userOptions_.vertex_has_color() )
              _bi.set_color( vh, Vec4uc( c4 ) );
            break;
        // rgb floats
        case 5 : stream >> c3f[0];  stream >> c3f[1];  stream >> c3f[2];
            if ( userOptions_.vertex_has_color() ) {
              _bi.set_color( vh, c3f );
              _opt += Options::ColorFloat;
            }
            break;
        // rgba floats
        case 6 : stream >> c4f[0];  stream >> c4f[1];  stream >> c4f[2]; stream >> c4f[3];
            if ( userOptions_.vertex_has_color() ) {
              _bi.set_color( vh, c4f );
              _opt += Options::ColorFloat;
            }
            break;

        default:
            std::cerr << "Error in file format (colorType = " << colorType << ")\n";
            break;
      }
    }
    //perhaps read TEXTURE COORDs
    if ( options_.vertex_has_texcoord() ){
      stream >> t[0]; stream >> t[1];
      if ( userOptions_.vertex_has_texcoord() )
        _bi.set_texcoord(vh, t);
    }
  }

  // faces
  // #N <v1> <v2> .. <v(n-1)> [color spec]
  for (i=0; i<nF; ++i)
  {
    // nV = number of Vertices for current face
    _in >> nV;

    if (nV == 3)
    {
      vhandles.resize(3);
      _in >> j;
      _in >> k;
      _in >> l;

      vhandles[0] = VertexHandle(j);
      vhandles[1] = VertexHandle(k);
      vhandles[2] = VertexHandle(l);
    }
    else
    {
      vhandles.clear();
      for (j=0; j<nV; ++j)
      {
         _in >> idx;
         vhandles.push_back(VertexHandle(idx));
      }
    }

    FaceHandle fh = _bi.add_face(vhandles);

    //perhaps read face COLOR
    if ( options_.face_has_color() ){

      //take the rest of the line and check how colors are defined
      std::string line;
      std::getline(_in,line);

      int colorType = getColorType(line, false );

      std::stringstream stream( line );

      std::string trash;

      switch (colorType){
        case 0 : break; //no color
        case 1 : stream >> trash; break; //one int (isn't handled atm)
        case 2 : stream >> trash; stream >> trash; break; //corrupt format (ignore)
        // rgb int
        case 3 : stream >> c3[0];  stream >> c3[1];  stream >> c3[2];
            if ( userOptions_.face_has_color() )
              _bi.set_color( fh, Vec3uc( c3 ) );
            break;
        // rgba int
        case 4 : stream >> c4[0];  stream >> c4[1];  stream >> c4[2]; stream >> c4[3];
            if ( userOptions_.face_has_color() )
              _bi.set_color( fh, Vec4uc( c4 ) );
            break;
        // rgb floats
        case 5 : stream >> c3f[0];  stream >> c3f[1];  stream >> c3f[2];
            if ( userOptions_.face_has_color() ) {
              _bi.set_color( fh, c3f );
              _opt += Options::ColorFloat;
            }
            break;
        // rgba floats
        case 6 : stream >> c4f[0];  stream >> c4f[1];  stream >> c4f[2]; stream >> c4f[3];
            if ( userOptions_.face_has_color() ) {
              _bi.set_color( fh, c4f );
              _opt += Options::ColorFloat;
            }
            break;

        default:
            std::cerr << "Error in file format (colorType = " << colorType << ")\n";
            break;
      }
    }
  }

  // File was successfully parsed.
  return true;
}